

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc_state_machine.hxx
# Opt level: O0

ptr<snapshot> __thiscall calc_server::calc_state_machine::last_snapshot(calc_state_machine *this)

{
  bool bVar1;
  pointer ppVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
  *in_RSI;
  element_type *in_RDI;
  ptr<snapshot> pVar3;
  ptr<snapshot_ctx> ctx;
  reverse_iterator entry;
  lock_guard<std::mutex> ll;
  map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
  *in_stack_ffffffffffffff78;
  element_type *__y;
  
  __y = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffff78);
  std::
  map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
  ::rbegin(in_stack_ffffffffffffff78);
  std::
  map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
  ::rend(in_stack_ffffffffffffff78);
  bVar1 = std::operator==(in_RSI,(reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
                                  *)__y);
  if (bVar1) {
    std::shared_ptr<nuraft::snapshot>::shared_ptr
              ((shared_ptr<nuraft::snapshot> *)in_RDI,in_stack_ffffffffffffff78);
  }
  else {
    ppVar2 = std::
             reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
             ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
                           *)in_RDI);
    std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>::shared_ptr
              ((shared_ptr<calc_server::calc_state_machine::snapshot_ctx> *)in_RDI,
               (shared_ptr<calc_server::calc_state_machine::snapshot_ctx> *)ppVar2);
    std::
    __shared_ptr_access<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x18f137);
    std::shared_ptr<nuraft::snapshot>::shared_ptr
              ((shared_ptr<nuraft::snapshot> *)in_RDI,(shared_ptr<nuraft::snapshot> *)ppVar2);
    std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>::~shared_ptr
              ((shared_ptr<calc_server::calc_state_machine::snapshot_ctx> *)0x18f156);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x18f160);
  pVar3.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar3.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __y;
  return (ptr<snapshot>)pVar3.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> last_snapshot() {
        // Just return the latest snapshot.
        std::lock_guard<std::mutex> ll(snapshots_lock_);
        auto entry = snapshots_.rbegin();
        if (entry == snapshots_.rend()) return nullptr;

        ptr<snapshot_ctx> ctx = entry->second;
        return ctx->snapshot_;
    }